

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O3

void * __thiscall
pbrt::TrackedMemoryResource::do_allocate(TrackedMemoryResource *this,size_t size,size_t alignment)

{
  atomic<unsigned_long> *paVar1;
  __int_type_conflict1 _Var2;
  int iVar3;
  undefined4 extraout_var;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  
  iVar3 = (*this->source->_vptr_memory_resource[2])();
  LOCK();
  paVar1 = &this->allocatedBytes;
  _Var2 = (paVar1->super___atomic_base<unsigned_long>)._M_i;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + size;
  UNLOCK();
  uVar6 = _Var2 + size;
  uVar4 = (this->maxAllocatedBytes).super___atomic_base<unsigned_long>._M_i;
  do {
    if (uVar6 <= uVar4) {
      return (void *)CONCAT44(extraout_var,iVar3);
    }
    LOCK();
    uVar5 = (this->maxAllocatedBytes).super___atomic_base<unsigned_long>._M_i;
    bVar7 = uVar4 == uVar5;
    if (bVar7) {
      (this->maxAllocatedBytes).super___atomic_base<unsigned_long>._M_i = uVar6;
      uVar5 = uVar4;
    }
    UNLOCK();
    uVar4 = uVar5;
  } while (!bVar7);
  return (void *)CONCAT44(extraout_var,iVar3);
}

Assistant:

void *do_allocate(size_t size, size_t alignment) {
        void *ptr = source->allocate(size, alignment);
        uint64_t currentBytes = allocatedBytes.fetch_add(size) + size;
        uint64_t prevMax = maxAllocatedBytes.load(std::memory_order_relaxed);
        while (prevMax < currentBytes &&
               !maxAllocatedBytes.compare_exchange_weak(prevMax, currentBytes))
            ;
        return ptr;
    }